

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_cacheflush(sqlite3 *db)

{
  Btree *p;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Pager *pPager_00;
  int local_38;
  Pager *pPager;
  Btree *pBt;
  int local_18;
  int bSeenBusy;
  int rc;
  int i;
  sqlite3 *db_local;
  
  local_18 = 0;
  bVar2 = false;
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  bSeenBusy = 0;
  while( true ) {
    bVar1 = false;
    if (local_18 == 0) {
      bVar1 = bSeenBusy < db->nDb;
    }
    if (!bVar1) break;
    p = db->aDb[bSeenBusy].pBt;
    if ((p != (Btree *)0x0) && (iVar3 = sqlite3BtreeIsInTrans(p), iVar3 != 0)) {
      pPager_00 = sqlite3BtreePager(p);
      local_18 = sqlite3PagerFlush(pPager_00);
      if (local_18 == 5) {
        bVar2 = true;
        local_18 = 0;
      }
    }
    bSeenBusy = bSeenBusy + 1;
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  if ((local_18 == 0) && (bVar2)) {
    local_38 = 5;
  }
  else {
    local_38 = local_18;
  }
  return local_38;
}

Assistant:

SQLITE_API int sqlite3_db_cacheflush(sqlite3 *db){
  int i;
  int rc = SQLITE_OK;
  int bSeenBusy = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt && sqlite3BtreeIsInTrans(pBt) ){
      Pager *pPager = sqlite3BtreePager(pBt);
      rc = sqlite3PagerFlush(pPager);
      if( rc==SQLITE_BUSY ){
        bSeenBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return ((rc==SQLITE_OK && bSeenBusy) ? SQLITE_BUSY : rc);
}